

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void __thiscall google::LogMessage::SaveOrSendToLog(LogMessage *this)

{
  char *pcVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  ulong uVar2;
  allocator local_41;
  value_type local_40;
  ulong local_20;
  size_t len;
  char *start;
  LogMessage *this_local;
  
  start = (char *)this;
  if ((this->data_->field_6).sink_ == (LogSink *)0x0) {
    SendToLog(this);
  }
  else {
    if ((this->data_->num_chars_to_log_ == 0) ||
       (this->data_->message_text_[this->data_->num_chars_to_log_ - 1] != '\n')) {
      RawLog__(FATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
               ,0x76b,"Check %s failed: %s",
               "data_->num_chars_to_log_ > 0 && data_->message_text_[data_->num_chars_to_log_ - 1] == \'\\n\'"
               ,"");
    }
    pcVar1 = this->data_->message_text_ + this->data_->num_prefix_chars_;
    uVar2 = ~this->data_->num_prefix_chars_ + this->data_->num_chars_to_log_;
    this_00 = (this->data_->field_6).outvec_;
    local_20 = uVar2;
    len = (size_t)pcVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,pcVar1,uVar2,&local_41);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(this_00,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  return;
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(log_mutex) {
  if (data_->outvec_ != nullptr) {
    RAW_DCHECK(data_->num_chars_to_log_ > 0 &&
                   data_->message_text_[data_->num_chars_to_log_ - 1] == '\n',
               "");
    // Omit prefix of message and trailing newline when recording in outvec_.
    const char* start = data_->message_text_ + data_->num_prefix_chars_;
    size_t len = data_->num_chars_to_log_ - data_->num_prefix_chars_ - 1;
    data_->outvec_->push_back(string(start, len));
  } else {
    SendToLog();
  }
}